

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

void __thiscall
fmt::v6::basic_memory_buffer<char,_500UL,_std::allocator<char>_>::grow
          (basic_memory_buffer<char,_500UL,_std::allocator<char>_> *this,size_t size)

{
  char *__src;
  ulong uVar1;
  size_t __n;
  pointer __dest;
  ulong __n_00;
  
  __src = (this->super_buffer<char>).ptr_;
  uVar1 = (this->super_buffer<char>).capacity_;
  __n_00 = (uVar1 >> 1) + uVar1;
  if (__n_00 <= size) {
    __n_00 = size;
  }
  __dest = bwt::std::allocator_traits<std::allocator<char>_>::allocate
                     ((allocator_type *)this,__n_00);
  __n = (this->super_buffer<char>).size_;
  if (__n != 0) {
    memmove(__dest,__src,__n);
  }
  (this->super_buffer<char>).ptr_ = __dest;
  (this->super_buffer<char>).capacity_ = __n_00;
  if (__src != this->store_) {
    operator_delete(__src,uVar1);
    return;
  }
  return;
}

Assistant:

void basic_memory_buffer<T, SIZE, Allocator>::grow(std::size_t size) {
#ifdef FUZZING_BUILD_MODE_UNSAFE_FOR_PRODUCTION
  if (size > 1000) throw std::runtime_error("fuzz mode - won't grow that much");
#endif
  std::size_t old_capacity = this->capacity();
  std::size_t new_capacity = old_capacity + old_capacity / 2;
  if (size > new_capacity) new_capacity = size;
  T* old_data = this->data();
  T* new_data = std::allocator_traits<Allocator>::allocate(*this, new_capacity);
  // The following code doesn't throw, so the raw pointer above doesn't leak.
  std::uninitialized_copy(old_data, old_data + this->size(),
                          internal::make_checked(new_data, new_capacity));
  this->set(new_data, new_capacity);
  // deallocate must not throw according to the standard, but even if it does,
  // the buffer already uses the new storage and will deallocate it in
  // destructor.
  if (old_data != store_) Allocator::deallocate(old_data, old_capacity);
}